

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xs_Float.h
# Opt level: O0

int32_t xs_CRoundToInt(real64 val,real64 dmr)

{
  undefined4 local_20;
  _xs_doubleints uval;
  real64 dmr_local;
  real64 val_local;
  
  local_20 = SUB84((double)val + (double)dmr,0);
  return local_20;
}

Assistant:

finline static int32_t xs_CRoundToInt(real64 val, real64 dmr)
{
#if _xs_DEFAULT_CONVERSION==0
	_xs_doubleints uval;
	uval.val = val + dmr;
	return uval.ival[_xs_iman_];
#else
    return int32_t(floor(val+.5));
#endif
}